

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg.c
# Opt level: O1

libcaption_stauts_t sei_from_scc(sei_t *sei,scc_t *scc)

{
  ulong uVar1;
  cea708_t cea708;
  cea708_t local_c0;
  
  cea708_init(&local_c0,sei->timestamp);
  if (scc->cc_size != 0) {
    uVar1 = 0;
    do {
      if ((~local_c0.user_data._0_4_ & 0xf8) == 0) {
        sei_append_708(sei,&local_c0);
      }
      cea708_add_cc_data(&local_c0,1,cc_type_ntsc_cc_field_1,
                         *(uint16_t *)((long)&scc[1].timestamp + uVar1 * 2));
      uVar1 = uVar1 + 1;
    } while (uVar1 < scc->cc_size);
  }
  if ((local_c0.user_data._0_4_ & 0xf8) != 0) {
    sei_append_708(sei,&local_c0);
  }
  return LIBCAPTION_OK;
}

Assistant:

libcaption_stauts_t sei_from_scc(sei_t* sei, const scc_t* scc)
{
    unsigned int i;
    cea708_t cea708;
    cea708_init(&cea708, sei->timestamp); // set up a new popon frame

    for (i = 0; i < scc->cc_size; ++i) {
        if (31 == cea708.user_data.cc_count) {
            sei_append_708(sei, &cea708);
        }

        cea708_add_cc_data(&cea708, 1, cc_type_ntsc_cc_field_1, scc->cc_data[i]);
    }

    if (0 != cea708.user_data.cc_count) {
        sei_append_708(sei, &cea708);
    }

    return LIBCAPTION_OK;
}